

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall Protocol::MQTT::Common::MappedVBInt::MappedVBInt(MappedVBInt *this)

{
  MappedVBInt *this_local;
  
  PODVisitor<unsigned_int>::PODVisitor(&this->super_PODVisitor<unsigned_int>,0);
  (this->super_PODVisitor<unsigned_int>).super_MemMappedVisitor._vptr_MemMappedVisitor =
       (_func_int **)&PTR_acceptBuffer_0014efb0;
  return;
}

Assistant:

struct MappedVBInt Final : public PODVisitor<uint32>
            {
                /** Get the value from this mapped variable byte integer
                    @param buffer       A pointer to the buffer to read from
                    @param bufLength    The length of the buffer to read from
                    @return the number of bytes used in the buffer */
                uint32 acceptBuffer(const uint8 * buffer, const uint32 bufLength)
                {
                    uint32 size = 0; uint32 & o = getValue(); o = 0;
                    for (size = 0; size < 4 && size < bufLength; )
                    {
                        if (size+1 > bufLength) return NotEnoughData;
                        if (buffer[size++] < 0x80) break;
                    }

                    switch(size)
                    {
                    default:
                    case 0: return BadData; // This is an error anyway
                    case 4: o = buffer[3] << 21;            // Intentionally no break here
                    // fall through
                    case 3: o |= (buffer[2] & 0x7F) << 14;  // Same
                    // fall through
                    case 2: o |= (buffer[1] & 0x7F) << 7;   // Ditto
                    // fall through
                    case 1: o |= buffer[0] & 0x7F; // Break is useless here too
                    }
                    return size;
                }
            }